

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_read_unsigned_bin(mp_int *a,uchar *b,int c)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  uVar4 = a->alloc;
  if ((int)uVar4 < 2) {
    iVar2 = mp_grow(a,2);
    if (iVar2 != 0) {
      return iVar2;
    }
    uVar4 = a->alloc;
    a->sign = 0;
    a->used = 0;
    if ((int)uVar4 < 1) goto LAB_0010838e;
  }
  else {
    a->sign = 0;
    a->used = 0;
  }
  memset(a->dp,0,(ulong)uVar4 << 3);
LAB_0010838e:
  if (0 < c) {
    iVar2 = c + 1;
    do {
      iVar3 = mp_mul_2d(a,8,a);
      if (iVar3 != 0) {
        return iVar3;
      }
      bVar1 = *b;
      b = b + 1;
      *a->dp = *a->dp | (ulong)bVar1;
      iVar3 = a->used;
      a->used = iVar3 + 1;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
    if (iVar3 < 0) {
      if (iVar3 + 1 != 0) {
        return 0;
      }
    }
    else {
      do {
        uVar4 = iVar3 + 1;
        if (a->dp[(ulong)uVar4 - 1] != 0) {
          return 0;
        }
        a->used = iVar3;
        iVar3 = iVar3 + -1;
      } while (1 < (int)uVar4);
    }
  }
  a->sign = 0;
  return 0;
}

Assistant:

int mp_read_unsigned_bin (mp_int * a, const unsigned char *b, int c)
{
  int     res;

  /* make sure there are at least two digits */
  if (a->alloc < 2) {
     if ((res = mp_grow(a, 2)) != MP_OKAY) {
        return res;
     }
  }

  /* zero the int */
  mp_zero (a);

  /* read the bytes in */
  while (c-- > 0) {
    if ((res = mp_mul_2d (a, 8, a)) != MP_OKAY) {
      return res;
    }

#ifndef MP_8BIT
      a->dp[0] |= *b++;
      a->used += 1;
#else
      a->dp[0] = (*b & MP_MASK);
      a->dp[1] |= ((*b++ >> 7U) & 1);
      a->used += 2;
#endif
  }
  mp_clamp (a);
  return MP_OKAY;
}